

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_paste(_glist *x)

{
  _glist *x_00;
  void *data;
  t_selection *local_38;
  t_selection *y_1;
  t_text *txt;
  t_gobj *y;
  int foundplace;
  int y0;
  int x0;
  int offset;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    _x0 = x;
    if (x->gl_editor->e_textedfor == (_rtext *)0x0) {
      y0 = 0;
      foundplace = 0;
      y._4_4_ = 0;
      y._0_4_ = 0;
      binbuf_getpos(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor,&foundplace,
                    (int *)((long)&y + 4),(t_symbol **)0x0);
      x_00 = _x0;
      do {
        y._0_4_ = 1;
        for (txt = (t_text *)_x0->gl_list; txt != (t_text *)0x0; txt = (t_text *)(txt->te_g).g_next)
        {
          if ((foundplace + y0 == (int)txt->te_xpix) && (y._4_4_ + y0 == (int)txt->te_ypix)) {
            y._0_4_ = 0;
            y0 = y0 + 10;
            break;
          }
        }
      } while ((int)y == 0);
      data = canvas_undo_set_paste(_x0,0,0,y0);
      canvas_undo_add(x_00,UNDO_PASTE,"paste",data);
      canvas_dopaste(_x0,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
      if (y0 != 0) {
        for (local_38 = _x0->gl_editor->e_selection; local_38 != (t_selection *)0x0;
            local_38 = local_38->sel_next) {
          gobj_displace(local_38->sel_what,_x0,y0,y0);
        }
      }
    }
    else {
      pdgui_vmess("pdtk_pastetext","^",x);
    }
  }
  return;
}

Assistant:

static void canvas_paste(t_canvas *x)
{
    if (!x->gl_editor)
        return;
    if (x->gl_editor->e_textedfor)
    {
            /* simulate keystrokes as if the copy buffer were typed in. */
        pdgui_vmess("pdtk_pastetext", "^", x);
    }
    else
    {
        int offset = 0;
        int x0 = 0, y0 = 0;
        int foundplace = 0;
        binbuf_getpos(EDITOR->copy_binbuf, &x0, &y0, 0);
        do {
                /* iterate over all existing objects
                 * to see whether one occupies the space we want.
                 * if so, move along
                 */
            t_gobj *y;
            foundplace = 1;
            for (y = x->gl_list; y; y = y->g_next) {
                t_text *txt = (t_text *)y;
                if((x0 + offset) == txt->te_xpix && (y0 + offset) == txt->te_ypix)
                {
                    foundplace = 0;
                    offset += PASTE_OFFSET;
                    break;
                }
            }
        } while(!foundplace);
        canvas_undo_add(x, UNDO_PASTE, "paste",
            (void *)canvas_undo_set_paste(x, 0, 0, offset));
        canvas_dopaste(x, EDITOR->copy_binbuf);
        if(offset)
        {
            t_selection *y;
            for (y = x->gl_editor->e_selection; y; y = y->sel_next)
                gobj_displace(y->sel_what, x,
                    offset, offset);
        }
    }
}